

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise::forward_int8
          (ConvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  char *pcVar3;
  undefined8 *in_RCX;
  Mat *in_RSI;
  long in_RDI;
  float sumfp32_3;
  float scale_in_3;
  char sums8_1;
  float scale_out_1;
  float sumfp32_2;
  float scale_in_2;
  char w_2;
  char val_1;
  int k_1;
  char *sptr_1;
  Mat m_1;
  int q;
  char *kptr_1;
  int sum_1;
  int j_2;
  int i_2;
  char *weight_data_ptr;
  char *outptr_1;
  int p;
  int g_2;
  int num_output_g;
  int channels_g_1;
  float sumfp32_1;
  float scale_in_1;
  char sums8;
  float scale_out;
  float sumfp32;
  float scale_in;
  char w_1;
  char val;
  int k;
  char *sptr;
  int sum;
  int j_1;
  int i_1;
  Mat m;
  char *kptr;
  char *outptr;
  int g_1;
  size_t out_elemsize;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outh;
  int outw;
  Mat bottom_blob_bordered;
  Mat bottom_blob_int8_g;
  Mat bottom_blob_g;
  Option opt_g;
  int g;
  int channels_g;
  Mat *in_stack_00000450;
  Mat bottom_blob_unbordered;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *in_stack_fffffffffffffb20;
  Mat *in_stack_fffffffffffffb28;
  int in_stack_fffffffffffffb30;
  float in_stack_fffffffffffffb34;
  Mat *in_stack_fffffffffffffb38;
  Mat *in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbec;
  float fVar4;
  Mat *in_stack_fffffffffffffbf0;
  Mat *in_stack_fffffffffffffbf8;
  ConvolutionDepthWise *in_stack_fffffffffffffc00;
  float local_3a4;
  float local_3a0;
  float local_39c;
  char local_396;
  char local_395;
  undefined4 local_394;
  float local_390;
  float local_38c;
  char local_386;
  char local_385;
  int local_384;
  char *local_380;
  Mat local_378;
  int local_334;
  char *local_330;
  int local_324;
  int local_320;
  int local_31c;
  char *local_318;
  Mat local_310;
  float *local_2d0;
  int local_2c4;
  int local_2c0;
  int local_2bc;
  int local_2b8;
  float local_2b4;
  float local_2b0;
  float local_2ac;
  char local_2a6;
  char local_2a5;
  undefined4 local_2a4;
  float local_2a0;
  float local_29c;
  char local_296;
  char local_295;
  int local_294;
  char *local_290;
  int local_284;
  int local_280;
  int local_27c;
  Mat local_278;
  char *local_238;
  Mat local_230;
  float *local_1f0;
  int local_1e4;
  ulong local_1e0;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  reference local_1c0;
  vector<int,_std::allocator<int>_> local_1b0;
  int local_194;
  int local_190;
  int local_18c;
  Mat local_188 [3];
  undefined4 local_c8;
  undefined4 uStack_c4;
  Allocator *pAStack_c0;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined8 local_a8;
  int local_a0;
  int local_9c;
  undefined4 local_98;
  Mat local_88;
  int local_48;
  int local_44;
  size_t local_40;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  int local_4;
  
  local_2c = in_RSI->w;
  local_30 = in_RSI->h;
  local_34 = in_RSI->c;
  local_40 = in_RSI->elemsize;
  if ((local_34 % *(int *)(in_RDI + 0xf0) != 0) ||
     (*(int *)(in_RDI + 0xb8) % *(int *)(in_RDI + 0xf0) != 0)) {
    return -100;
  }
  local_44 = *(int *)(in_RDI + 0xc4) * (*(int *)(in_RDI + 0xbc) + -1) + 1;
  local_48 = *(int *)(in_RDI + 200) * (*(int *)(in_RDI + 0xc0) + -1) + 1;
  local_28 = in_RCX;
  Mat::Mat(&local_88,in_RSI);
  if (local_40 != 1) {
    Mat::create(in_stack_fffffffffffffb40,(int)((ulong)in_stack_fffffffffffffb38 >> 0x20),
                (int)in_stack_fffffffffffffb38,(int)in_stack_fffffffffffffb34,
                (size_t)in_stack_fffffffffffffb28,(Allocator *)in_stack_fffffffffffffb20);
    bVar1 = Mat::empty(in_stack_fffffffffffffb20);
    if (bVar1) {
      local_4 = -100;
      local_98 = 1;
      goto LAB_001a359d;
    }
    local_9c = local_34 / *(int *)(in_RDI + 0xf0);
    for (local_a0 = 0; local_a0 < *(int *)(in_RDI + 0xf0); local_a0 = local_a0 + 1) {
      local_a8 = local_28[4];
      local_b8 = *(undefined4 *)(local_28 + 2);
      uStack_b4 = *(undefined4 *)((long)local_28 + 0x14);
      uStack_b0 = *(undefined4 *)(local_28 + 3);
      uStack_ac = *(undefined4 *)((long)local_28 + 0x1c);
      _local_c8 = CONCAT44(1,(int)*local_28);
      pAStack_c0 = local_88.allocator;
      Mat::channel_range(in_stack_fffffffffffffb38,(int)in_stack_fffffffffffffb34,
                         in_stack_fffffffffffffb30);
      Mat::channel_range(in_stack_fffffffffffffb38,(int)in_stack_fffffffffffffb34,
                         in_stack_fffffffffffffb30);
      Mat::operator[]((Mat *)(in_RDI + 0x200),(long)local_a0);
      quantize_float32_to_int8(in_stack_00000450,_g,(float)opt_g._36_4_,(Option *)opt_g._24_8_);
      Mat::~Mat((Mat *)0x1a233a);
      Mat::~Mat((Mat *)0x1a2347);
    }
  }
  Mat::Mat(local_188);
  make_padding(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
               (Option *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  bVar1 = Mat::empty(in_stack_fffffffffffffb20);
  if (bVar1) {
    local_4 = -100;
    local_98 = 1;
  }
  else {
    local_2c = local_188[0].w;
    local_30 = local_188[0].h;
    local_18c = (local_188[0].w - local_44) / *(int *)(in_RDI + 0xcc) + 1;
    local_190 = (local_188[0].h - local_48) / *(int *)(in_RDI + 0xd0) + 1;
    local_194 = *(int *)(in_RDI + 0xbc) * *(int *)(in_RDI + 0xc0);
    std::allocator<int>::allocator((allocator<int> *)0x1a24d8);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb40,
               (size_type)in_stack_fffffffffffffb38,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
    std::allocator<int>::~allocator((allocator<int> *)0x1a2504);
    local_1c0 = std::vector<int,_std::allocator<int>_>::operator[](&local_1b0,0);
    local_1c4 = 0;
    local_1c8 = 0;
    local_1cc = local_2c * *(int *)(in_RDI + 200) -
                *(int *)(in_RDI + 0xbc) * *(int *)(in_RDI + 0xc4);
    for (local_1d0 = 0; local_1d0 < *(int *)(in_RDI + 0xc0); local_1d0 = local_1d0 + 1) {
      for (local_1d4 = 0; local_1d4 < *(int *)(in_RDI + 0xbc); local_1d4 = local_1d4 + 1) {
        local_1c0[local_1c4] = local_1c8;
        local_1c4 = local_1c4 + 1;
        local_1c8 = *(int *)(in_RDI + 0xc4) + local_1c8;
      }
      local_1c8 = local_1cc + local_1c8;
    }
    local_1e0 = (ulong)(((byte)~*(byte *)(in_RDI + 0x244) & 1) * 3 + 1);
    Mat::create(in_stack_fffffffffffffb40,(int)((ulong)in_stack_fffffffffffffb38 >> 0x20),
                (int)in_stack_fffffffffffffb38,(int)in_stack_fffffffffffffb34,
                (size_t)in_stack_fffffffffffffb28,(Allocator *)in_stack_fffffffffffffb20);
    bVar1 = Mat::empty(in_stack_fffffffffffffb20);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      if ((local_34 == *(int *)(in_RDI + 0xf0)) &&
         (*(int *)(in_RDI + 0xf0) == *(int *)(in_RDI + 0xb8))) {
        for (local_1e4 = 0; local_1e4 < *(int *)(in_RDI + 0xf0); local_1e4 = local_1e4 + 1) {
          Mat::channel(in_stack_fffffffffffffb28,(int)((ulong)in_stack_fffffffffffffb20 >> 0x20));
          pfVar2 = (float *)Mat::operator_cast_to_signed_char_(&local_230);
          Mat::~Mat((Mat *)0x1a27a5);
          local_1f0 = pfVar2;
          local_238 = Mat::operator_cast_to_signed_char_((Mat *)(in_RDI + 0x140));
          local_238 = local_238 + local_194 * local_1e4;
          Mat::channel(in_stack_fffffffffffffb28,(int)((ulong)in_stack_fffffffffffffb20 >> 0x20));
          for (local_27c = 0; local_27c < local_190; local_27c = local_27c + 1) {
            for (local_280 = 0; local_280 < local_18c; local_280 = local_280 + 1) {
              local_284 = 0;
              local_290 = Mat::row<signed_char>(&local_278,local_27c * *(int *)(in_RDI + 0xd0));
              local_290 = local_290 + local_280 * *(int *)(in_RDI + 0xcc);
              for (local_294 = 0; local_294 < local_194; local_294 = local_294 + 1) {
                local_295 = local_290[local_1c0[local_294]];
                local_296 = local_238[local_294];
                local_284 = (int)local_295 * (int)local_296 + local_284;
              }
              if ((*(byte *)(in_RDI + 0x244) & 1) == 0) {
                pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x1c0),(long)local_1e4);
                if ((*pfVar2 != 0.0) || (NAN(*pfVar2))) {
                  pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x200),(long)local_1e4);
                  fVar4 = *pfVar2;
                  pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x1c0),(long)local_1e4);
                  local_2ac = 1.0 / (fVar4 * *pfVar2);
                }
                else {
                  local_2ac = 0.0;
                }
                local_2b0 = (float)local_284 * local_2ac;
                if (*(int *)(in_RDI + 0xe8) != 0) {
                  pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x180),(long)local_1e4);
                  local_2b0 = *pfVar2 + local_2b0;
                }
                if (*(int *)(in_RDI + 0xf8) == 1) {
                  local_2b4 = 0.0;
                  pfVar2 = std::max<float>(&local_2b0,&local_2b4);
                  local_2b0 = *pfVar2;
                }
                *local_1f0 = local_2b0;
                local_1f0 = local_1f0 + 1;
              }
              else {
                pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x1c0),(long)local_1e4);
                if ((*pfVar2 != 0.0) || (NAN(*pfVar2))) {
                  pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x200),(long)local_1e4);
                  fVar4 = *pfVar2;
                  pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x1c0),(long)local_1e4);
                  local_29c = 1.0 / (fVar4 * *pfVar2);
                }
                else {
                  local_29c = 0.0;
                }
                local_2a0 = (float)local_284 * local_29c;
                if (*(int *)(in_RDI + 0xe8) != 0) {
                  pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x180),(long)local_1e4);
                  local_2a0 = *pfVar2 + local_2a0;
                }
                local_2a4 = *(undefined4 *)(in_RDI + 0x240);
                local_2a5 = float2int8(SUB84(in_stack_fffffffffffffb20,0));
                if (*(int *)(in_RDI + 0xf8) == 1) {
                  local_2a6 = '\0';
                  pcVar3 = std::max<signed_char>(&local_2a5,&local_2a6);
                  local_2a5 = *pcVar3;
                }
                *(char *)local_1f0 = local_2a5;
                local_1f0 = (float *)((long)local_1f0 + 1);
              }
            }
          }
          Mat::~Mat((Mat *)0x1a2db7);
        }
      }
      else {
        local_2b8 = local_34 / *(int *)(in_RDI + 0xf0);
        local_2bc = *(int *)(in_RDI + 0xb8) / *(int *)(in_RDI + 0xf0);
        for (local_2c0 = 0; local_2c0 < *(int *)(in_RDI + 0xf0); local_2c0 = local_2c0 + 1) {
          for (local_2c4 = 0; local_2c4 < local_2bc; local_2c4 = local_2c4 + 1) {
            Mat::channel(in_stack_fffffffffffffb28,(int)((ulong)in_stack_fffffffffffffb20 >> 0x20));
            pfVar2 = (float *)Mat::operator_cast_to_signed_char_(&local_310);
            Mat::~Mat((Mat *)0x1a2e9d);
            local_2d0 = pfVar2;
            local_318 = Mat::operator_cast_to_signed_char_((Mat *)(in_RDI + 0x140));
            local_318 = local_318 + local_194 * local_2b8 * local_2bc * local_2c0;
            for (local_31c = 0; local_31c < local_190; local_31c = local_31c + 1) {
              for (local_320 = 0; local_320 < local_18c; local_320 = local_320 + 1) {
                local_324 = 0;
                local_330 = local_318 + local_194 * local_2b8 * local_2c4;
                for (local_334 = 0; local_334 < local_2b8; local_334 = local_334 + 1) {
                  Mat::channel(in_stack_fffffffffffffb28,
                               (int)((ulong)in_stack_fffffffffffffb20 >> 0x20));
                  local_380 = Mat::row<signed_char>(&local_378,local_31c * *(int *)(in_RDI + 0xd0));
                  local_380 = local_380 + local_320 * *(int *)(in_RDI + 0xcc);
                  for (local_384 = 0; local_384 < local_194; local_384 = local_384 + 1) {
                    local_385 = local_380[local_1c0[local_384]];
                    local_386 = local_330[local_384];
                    local_324 = (int)local_385 * (int)local_386 + local_324;
                  }
                  local_330 = local_330 + local_194;
                  Mat::~Mat((Mat *)0x1a3121);
                }
                if ((*(byte *)(in_RDI + 0x244) & 1) == 0) {
                  pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x1c0),(long)local_2c0);
                  if ((*pfVar2 != 0.0) || (NAN(*pfVar2))) {
                    pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x200),(long)local_2c0);
                    in_stack_fffffffffffffb34 = *pfVar2;
                    pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x1c0),(long)local_2c0);
                    local_39c = 1.0 / (in_stack_fffffffffffffb34 * *pfVar2);
                  }
                  else {
                    local_39c = 0.0;
                  }
                  local_3a0 = (float)local_324 * local_39c;
                  if (*(int *)(in_RDI + 0xe8) != 0) {
                    in_stack_fffffffffffffb28 =
                         (Mat *)Mat::operator[]((Mat *)(in_RDI + 0x180),
                                                (long)(local_2c0 * local_2bc + local_2c4));
                    local_3a0 = *(float *)&in_stack_fffffffffffffb28->data + local_3a0;
                  }
                  if (*(int *)(in_RDI + 0xf8) == 1) {
                    local_3a4 = 0.0;
                    in_stack_fffffffffffffb20 = (Mat *)std::max<float>(&local_3a0,&local_3a4);
                    local_3a0 = *(float *)&in_stack_fffffffffffffb20->data;
                  }
                  *local_2d0 = local_3a0;
                  local_2d0 = local_2d0 + 1;
                }
                else {
                  pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x1c0),(long)local_2c0);
                  if ((*pfVar2 != 0.0) || (NAN(*pfVar2))) {
                    pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x200),(long)local_2c0);
                    fVar4 = *pfVar2;
                    pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x1c0),(long)local_2c0);
                    local_38c = 1.0 / (fVar4 * *pfVar2);
                  }
                  else {
                    local_38c = 0.0;
                  }
                  local_390 = (float)local_324 * local_38c;
                  if (*(int *)(in_RDI + 0xe8) != 0) {
                    pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x180),
                                             (long)(local_2c0 * local_2bc + local_2c4));
                    local_390 = *pfVar2 + local_390;
                  }
                  local_394 = *(undefined4 *)(in_RDI + 0x240);
                  local_395 = float2int8(SUB84(in_stack_fffffffffffffb20,0));
                  if (*(int *)(in_RDI + 0xf8) == 1) {
                    local_396 = '\0';
                    pcVar3 = std::max<signed_char>(&local_395,&local_396);
                    local_395 = *pcVar3;
                  }
                  *(char *)local_2d0 = local_395;
                  local_2d0 = (float *)((long)local_2d0 + 1);
                }
              }
            }
          }
        }
      }
      local_4 = 0;
    }
    local_98 = 1;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
  }
  Mat::~Mat((Mat *)0x1a358c);
LAB_001a359d:
  Mat::~Mat((Mat *)0x1a35aa);
  return local_4;
}

Assistant:

int ConvolutionDepthWise::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

//     fprintf(stderr, "ConvolutionDepthWise input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (elemsize != 1)
    {
        bottom_blob_unbordered.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_unbordered.empty())
            return -100;

        const int channels_g = channels / group;

        // quantize, scale and round to nearest
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            Option opt_g = opt;
            opt_g.num_threads = 1;
            opt_g.blob_allocator = bottom_blob_unbordered.allocator;

            const Mat bottom_blob_g = bottom_blob.channel_range(channels_g * g, channels_g);
            Mat bottom_blob_int8_g = bottom_blob_unbordered.channel_range(channels_g * g, channels_g);

            quantize_float32_to_int8(bottom_blob_g, bottom_blob_int8_g, bottom_blob_int8_scales[g], opt_g);
        }
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_unbordered, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // int8
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            signed char* outptr = top_blob.channel(g);
            const signed char* kptr = (const signed char*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    int sum = 0;

                    const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        signed char val = sptr[ space_ofs[k] ];
                        signed char w = kptr[k];
                        sum += val * w;
                    }

                    if (use_int8_requantize)
                    {
                        // requantize and relu
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float sumfp32 = sum * scale_in;

                        if (bias_term)
                            sumfp32 += bias_data[g];

                        float scale_out = top_blob_int8_scale;//FIXME load param

                        signed char sums8 = float2int8(sumfp32 * scale_out);

                        if (activation_type == 1)
                        {
                            sums8 = std::max(sums8, (signed char)0);
                        }

                        outptr[0] = sums8;
                        outptr += 1;
                    }
                    else
                    {
                        // dequantize and relu
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float sumfp32 = sum * scale_in;

                        if (bias_term)
                            sumfp32 += bias_data[g];

                        if (activation_type == 1)
                        {
                            sumfp32 = std::max(sumfp32, 0.f);
                        }

                        ((float*)outptr)[0] = sumfp32;
                        outptr += 4;
                    }
                }
            }
        }
    }
    else
    {
        // group convolution
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
        for (int g=0; g<group; g++)
        {
            for (int p=0; p<num_output_g; p++)
            {
                signed char* outptr = top_blob.channel(g * num_output_g + p);
                const signed char* weight_data_ptr = (const signed char*)weight_data + maxk * channels_g * num_output_g * g;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        int sum = 0;

                        const signed char* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q=0; q<channels_g; q++)
                        {
                            const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                            const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[ space_ofs[k] ];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        if (use_int8_requantize)
                        {
                            // requantize and relu
                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g * num_output_g + p];

                            float scale_out = top_blob_int8_scale;//FIXME load param

                            signed char sums8 = float2int8(sumfp32 * scale_out);

                            if (activation_type == 1)
                            {
                                sums8 = std::max(sums8, (signed char)0);
                            }

                            outptr[0] = sums8;
                            outptr += 1;
                        }
                        else
                        {
                            // dequantize and relu
                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g * num_output_g + p];

                            if (activation_type == 1)
                            {
                                sumfp32 = std::max(sumfp32, 0.f);
                            }

                            ((float*)outptr)[0] = sumfp32;
                            outptr += 4;
                        }
                    }
                }
            }
        }
    }

    return 0;
}